

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O3

void __thiscall DIS::IFFPdu::~IFFPdu(IFFPdu *this)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pIVar3;
  
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__IFFPdu_001b4e60;
  pIVar1 = (this->_iffParameters).
           super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->_iffParameters).
           super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = pIVar1;
  if (pIVar2 != pIVar1) {
    do {
      (**pIVar3->_vptr_IFFFundamentalParameterData)(pIVar3);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar2);
    (this->_iffParameters).
    super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  std::vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>::
  ~vector(&this->_iffParameters);
  SecondaryOperationalData::~SecondaryOperationalData(&this->_secondaryOperationalData);
  BeamData::~BeamData(&this->_beamData);
  LayerHeader::~LayerHeader(&this->_layerHeader);
  FundamentalOperationalData::~FundamentalOperationalData(&this->_fundamentalOperationalData);
  SystemIdentifier::~SystemIdentifier(&this->_systemID);
  Vector3Float::~Vector3Float(&this->_relativeAntennaLocation);
  EventIdentifier::~EventIdentifier(&this->_eventID);
  EntityID::~EntityID(&this->_emittingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

IFFPdu::~IFFPdu()
{
    _iffParameters.clear();
}